

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O3

bool __thiscall luna::Table::NextKeyValue(Table *this,Value *key,Value *next_key,Value *next_value)

{
  double __x;
  vector<luna::Value,_std::allocator<luna::Value>_> *pvVar1;
  _Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
  *puVar2;
  bool bVar3;
  ulong uVar4;
  iterator iVar5;
  _Hash_node_base *p_Var6;
  anon_union_8_9_8deb4486_for_Value_0 *paVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  
  if (key->type_ == ValueT_Number) {
    __x = (key->field_0).num_;
    dVar9 = floor(__x);
    if ((dVar9 != __x) || (NAN(dVar9) || NAN(__x))) goto LAB_0012564e;
    uVar4 = (long)(__x - 9.223372036854776e+18) & (long)__x >> 0x3f | (long)__x;
    uVar8 = uVar4 + 1;
    if ((uVar8 == 0) ||
       ((pvVar1 = (this->array_)._M_t.
                  super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                  .
                  super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>
                  ._M_head_impl, pvVar1 == (vector<luna::Value,_std::allocator<luna::Value>_> *)0x0
        || ((ulong)((long)*(pointer *)
                           ((long)&(pvVar1->
                                   super__Vector_base<luna::Value,_std::allocator<luna::Value>_>).
                                   _M_impl + 8) -
                    *(long *)&(pvVar1->super__Vector_base<luna::Value,_std::allocator<luna::Value>_>
                              )._M_impl >> 4) < uVar8)))) goto LAB_0012564e;
    auVar10._8_4_ = (int)(uVar8 >> 0x20);
    auVar10._0_8_ = uVar8;
    auVar10._12_4_ = 0x45300000;
    (next_key->field_0).num_ =
         (auVar10._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
    next_key->type_ = ValueT_Number;
    paVar7 = (anon_union_8_9_8deb4486_for_Value_0 *)
             (uVar4 * 0x10 +
             *(long *)&(((this->array_)._M_t.
                         super___uniq_ptr_impl<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<luna::Value,_std::allocator<luna::Value>_>_*,_false>
                        ._M_head_impl)->
                       super__Vector_base<luna::Value,_std::allocator<luna::Value>_>)._M_impl);
LAB_0012568f:
    next_value->type_ = *(ValueT *)(paVar7 + 1);
    next_value->field_0 = *paVar7;
    bVar3 = true;
  }
  else {
LAB_0012564e:
    this_00 = &((this->hash_)._M_t.
                super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                .
                super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
               ._M_head_impl)->_M_h;
    if (this_00 !=
        (_Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)0x0) {
      iVar5 = std::
              _Hashtable<luna::Value,_std::pair<const_luna::Value,_luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>,_std::__detail::_Select1st,_std::equal_to<luna::Value>,_std::hash<luna::Value>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(this_00,key);
      if (iVar5.super__Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true>._M_cur ==
          (__node_type *)0x0) {
        puVar2 = (this->hash_)._M_t.
                 super___uniq_ptr_impl<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                 .
                 super__Head_base<0UL,_std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_*,_false>
                 ._M_head_impl;
        if ((puVar2->_M_h)._M_element_count != 0) {
          p_Var6 = (puVar2->_M_h)._M_before_begin._M_nxt;
          goto LAB_0012567d;
        }
      }
      else {
        p_Var6 = *(_Hash_node_base **)
                  iVar5.super__Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true>.
                  _M_cur;
        if (p_Var6 != (_Hash_node_base *)0x0) {
LAB_0012567d:
          next_key->type_ = *(ValueT *)&p_Var6[2]._M_nxt;
          next_key->field_0 = *(anon_union_8_9_8deb4486_for_Value_0 *)(p_Var6 + 1);
          paVar7 = (anon_union_8_9_8deb4486_for_Value_0 *)(p_Var6 + 3);
          goto LAB_0012568f;
        }
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Table::NextKeyValue(const Value &key, Value &next_key, Value &next_value)
    {
        // array part
        if (key.type_ == ValueT_Number && IsInt(key.num_))
        {
            std::size_t index = static_cast<std::size_t>(key.num_) + 1;
            if (index >= 1 && index <= ArraySize())
            {
                next_key.num_ = index;
                next_key.type_ = ValueT_Number;
                next_value = (*array_)[index - 1];
                return true;
            }
        }

        // hash part
        if (hash_)
        {
            auto it = hash_->find(key);
            if (it == hash_->end() && !hash_->empty())
            {
                it = hash_->begin();
                next_key = it->first;
                next_value = it->second;
                return true;
            }

            if (it != hash_->end() && ++it != hash_->end())
            {
                next_key = it->first;
                next_value = it->second;
                return true;
            }
        }

        return false;
    }